

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_packet.cxx
# Opt level: O2

void __thiscall xray_re::xr_packet::r_sz(xr_packet *this,string *value)

{
  uint8_t *__last;
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *puVar3;
  size_t sVar4;
  
  sVar2 = this->m_r_pos;
  puVar3 = this->m_buf + (sVar2 - 1);
  sVar4 = sVar2;
  do {
    if (0xfff < sVar4) {
      __assert_fail("m_r_pos < sizeof(m_buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_packet.cxx"
                    ,0x5d,"void xray_re::xr_packet::r_sz(std::string &)");
    }
    sVar4 = sVar4 + 1;
    this->m_r_pos = sVar4;
    __last = puVar3 + 1;
    puVar1 = puVar3 + 1;
    puVar3 = __last;
  } while (*puVar1 != '\0');
  std::__cxx11::string::assign<unsigned_char*,void>((string *)value,this->m_buf + sVar2,__last);
  return;
}

Assistant:

void xr_packet::r_sz(std::string& value)
{
	uint8_t* p = &m_buf[m_r_pos];
	while (m_r_pos < sizeof(m_buf)) {
		if (m_buf[m_r_pos++] == 0) {
			value.assign(p, &m_buf[m_r_pos - 1]);
			return;
		}
	}
	// crash in debug mode if no 0 in the packet
	assert(m_r_pos < sizeof(m_buf));
	value.assign(p, m_buf + m_r_pos);
}